

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O1

BigDictionaryTypeHandler * __thiscall
Js::ES5ArrayTypeHandlerBase<int>::NewBigDictionaryTypeHandler
          (ES5ArrayTypeHandlerBase<int> *this,Recycler *recycler,int slotCapacity,
          uint16 inlineSlotCapacity,uint16 offsetOfInlineSlots)

{
  Recycler *alloc;
  ES5ArrayTypeHandlerBase<int> *this_00;
  undefined6 in_register_00000082;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  data._36_4_ = SUB84(CONCAT62(in_register_00000082,offsetOfInlineSlots),0);
  local_60 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9b91433;
  data.filename._0_4_ = 0x4e9;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_60);
  this_00 = (ES5ArrayTypeHandlerBase<int> *)new<Memory::Recycler>(0x40,alloc,0x38bbb2);
  ES5ArrayTypeHandlerBase<int>(this_00,recycler,slotCapacity,inlineSlotCapacity,data._36_2_,this);
  return &this_00->super_DictionaryTypeHandlerBase<int>;
}

Assistant:

BigDictionaryTypeHandler* ES5ArrayTypeHandlerBase<T>::NewBigDictionaryTypeHandler(Recycler* recycler, int slotCapacity, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots)
    {
        return RecyclerNew(recycler, BigES5ArrayTypeHandler, recycler, slotCapacity, inlineSlotCapacity, offsetOfInlineSlots, this);
    }